

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O2

void nosimd::arithmetic::div<long>(long *pSrc1,long *pSrc2,long *pDst,int len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (0 < len) {
    uVar2 = (ulong)(uint)len;
  }
  uVar1 = 0;
  if (pSrc1 == pDst) {
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      pDst[uVar1] = pDst[uVar1] / pSrc2[uVar1];
    }
  }
  else {
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      pDst[uVar1] = pSrc1[uVar1] / pSrc2[uVar1];
    }
  }
  return;
}

Assistant:

inline void div(const _T * pSrc1, const _T * pSrc2, _T * pDst, int len)
        {
            if (pSrc1 == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] /= pSrc2[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc1[i] / pSrc2[i];
            }
        }